

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O0

int Wla_ManCheckCombUnsat(Wla_Man_t *pWla,Aig_Man_t *pAig)

{
  Pdr_Par_t *pPars;
  int iVar1;
  uint uVar2;
  abctime aVar3;
  abctime aVar4;
  Pdr_Man_t *p;
  int nAnds;
  Ssw_Pars_t *pScorrPars;
  Ssw_Pars_t ScorrPars;
  Aig_Man_t *pAigScorr;
  int RetValue;
  abctime clk;
  Pdr_Par_t *pPdrPars;
  Pdr_Man_t *pPdr;
  Aig_Man_t *pAig_local;
  Wla_Man_t *pWla_local;
  
  pPars = (Pdr_Par_t *)pWla->pPdrPars;
  iVar1 = Aig_ManAndNum(pAig);
  if (iVar1 < 0x4e21) {
    aVar3 = Abc_Clock();
    Ssw_ManSetDefaultParams((Ssw_Pars_t *)&pScorrPars);
    ScorrPars.fEquivDump = 1;
    ScorrPars.nPartSize = 1;
    ScorrPars.pFunc = Ssw_SignalCorrespondence(pAig,(Ssw_Pars_t *)&pScorrPars);
    if ((Aig_Man_t *)ScorrPars.pFunc == (Aig_Man_t *)0x0) {
      __assert_fail("pAigScorr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs.c"
                    ,0x5ad,"int Wla_ManCheckCombUnsat(Wla_Man_t *, Aig_Man_t *)");
    }
    uVar2 = Aig_ManAndNum((Aig_Man_t *)ScorrPars.pFunc);
    Aig_ManStop((Aig_Man_t *)ScorrPars.pFunc);
    if (uVar2 == 0) {
      if (pWla->pPars->fVerbose != 0) {
        aVar4 = Abc_Clock();
        Abc_PrintTime(1,"SCORR proved UNSAT. Time",aVar4 - aVar3);
      }
      return 1;
    }
    if (pWla->pPars->fVerbose != 0) {
      Abc_Print(1,"SCORR failed with %d ANDs. ",(ulong)uVar2);
      aVar4 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar4 - aVar3);
    }
  }
  aVar3 = Abc_Clock();
  pPars->fVerbose = 0;
  p = Pdr_ManStart(pAig,pPars,(Vec_Int_t *)0x0);
  iVar1 = IPdr_ManCheckCombUnsat(p);
  Pdr_ManStop(p);
  pPars->fVerbose = pWla->pPars->fPdrVerbose;
  aVar4 = Abc_Clock();
  pWla->tPdr = (aVar4 - aVar3) + pWla->tPdr;
  return iVar1;
}

Assistant:

int Wla_ManCheckCombUnsat( Wla_Man_t * pWla, Aig_Man_t * pAig )
{
    Pdr_Man_t * pPdr;
    Pdr_Par_t * pPdrPars = (Pdr_Par_t *)pWla->pPdrPars;
    abctime clk;
    int RetValue = -1;

    if ( Aig_ManAndNum( pAig ) <= 20000 )
    { 
        Aig_Man_t * pAigScorr;
        Ssw_Pars_t ScorrPars, * pScorrPars = &ScorrPars;
        int nAnds;

        clk = Abc_Clock();

        Ssw_ManSetDefaultParams( pScorrPars );
        pScorrPars->fStopWhenGone = 1;
        pScorrPars->nFramesK = 1;
        pAigScorr = Ssw_SignalCorrespondence( pAig, pScorrPars );
        assert ( pAigScorr );
        nAnds = Aig_ManAndNum( pAigScorr); 
        Aig_ManStop( pAigScorr );

        if ( nAnds == 0 )
        {
            if ( pWla->pPars->fVerbose )
                Abc_PrintTime( 1, "SCORR proved UNSAT. Time", Abc_Clock() - clk );
            return 1;
        }
        else if ( pWla->pPars->fVerbose )
        {
            Abc_Print( 1, "SCORR failed with %d ANDs. ", nAnds);
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
    }

    clk = Abc_Clock();

    pPdrPars->fVerbose = 0;
    pPdr = Pdr_ManStart( pAig, pPdrPars, NULL );
    RetValue = IPdr_ManCheckCombUnsat( pPdr );
    Pdr_ManStop( pPdr );
    pPdrPars->fVerbose = pWla->pPars->fPdrVerbose;

    pWla->tPdr += Abc_Clock() - clk;

    return RetValue;
}